

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PltFileManager.cpp
# Opt level: O0

void __thiscall
pele::physics::pltfilemanager::PltFileManager::fillPatchFromPlt
          (PltFileManager *this,int a_lev,Geometry *a_level_geom,int pltComp,int dataComp,int nComp,
          MultiFab *a_mf)

{
  initializer_list<amrex::MultiFab_*> iVar1;
  initializer_list<double> iVar2;
  initializer_list<amrex::MultiFab_*> iVar3;
  initializer_list<double> iVar4;
  initializer_list<amrex::MultiFab_*> iVar5;
  initializer_list<double> iVar6;
  undefined8 uVar7;
  FArrayBox *pFVar8;
  bool bVar9;
  Geometry *pGVar10;
  Geometry *pGVar11;
  long lVar12;
  Long LVar13;
  Geometry *pGVar14;
  int iVar15;
  int iVar16;
  Geometry *in_RDX;
  int in_ESI;
  int iVar17;
  int iVar18;
  int i;
  int in_R9D;
  IntVect IVar19;
  PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
  fine_bndry_func_3;
  PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
  crse_bndry_func_3;
  MultiFab temp_2;
  PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_> bndry_func_2;
  MultiFab temp_3;
  IntVect rr_1;
  int pltlev_1;
  PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
  fine_bndry_func_2;
  PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
  crse_bndry_func_2;
  InterpBase *mapper_1;
  IntVect lev0rr_1;
  PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
  fine_bndry_func_1;
  PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
  crse_bndry_func_1;
  MultiFab temp;
  PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_> bndry_func_1;
  MultiFab temp_1;
  IntVect rr;
  int pltlev;
  PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
  fine_bndry_func;
  PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
  crse_bndry_func;
  InterpBase *mapper;
  PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_> bndry_func;
  IntVect lev0rr;
  int n_1;
  int n;
  int idim;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> dummyBCRec;
  int r;
  GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy> *in_stack_ffffffffffffe3a8;
  GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy> *pGVar20;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *in_stack_ffffffffffffe3b0;
  Geometry *pGVar21;
  Geometry *in_stack_ffffffffffffe3b8;
  undefined4 in_stack_ffffffffffffe3c0;
  undefined4 uVar22;
  undefined4 in_stack_ffffffffffffe3c4;
  undefined1 *puVar23;
  int in_stack_ffffffffffffe3d4;
  FabArray<amrex::FArrayBox> *pFVar24;
  FabArray<amrex::FArrayBox> *pFVar25;
  BoxArray *pBVar26;
  CpOp CVar27;
  undefined4 in_stack_ffffffffffffe3f4;
  FabFactory<amrex::FArrayBox> *pFVar28;
  char *in_stack_ffffffffffffe5c8;
  undefined8 in_stack_ffffffffffffe5d0;
  undefined4 in_stack_ffffffffffffe5d8;
  undefined4 in_stack_ffffffffffffe5dc;
  undefined4 in_stack_ffffffffffffe5e0;
  undefined4 in_stack_ffffffffffffe5e4;
  BATType local_1960;
  BATType local_195c;
  undefined1 local_18ea [16];
  FillExtDirDummy local_18da;
  GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy> local_18d9;
  undefined1 local_18d8 [238];
  FillExtDirDummy local_17ea;
  GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy> local_17e9;
  Geometry local_17e8;
  undefined8 local_1700;
  undefined8 local_16f8;
  undefined8 uStack_16f0;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  undefined8 local_16d8;
  int in_stack_ffffffffffffe9d4;
  int in_stack_ffffffffffffe9d8;
  int in_stack_ffffffffffffe9dc;
  MultiFab *in_stack_ffffffffffffe9e0;
  Real in_stack_ffffffffffffe9e8;
  int in_stack_ffffffffffffe9f0;
  int in_stack_ffffffffffffe9f4;
  MultiFab *in_stack_ffffffffffffe9f8;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_ffffffffffffea00;
  Real in_stack_ffffffffffffea08;
  IntVect *in_stack_ffffffffffffea10;
  MultiFab *in_stack_ffffffffffffea18;
  undefined8 local_14e0;
  undefined8 *local_14d8;
  undefined8 local_14d0;
  MultiFab *local_14a8;
  MultiFab **local_14a0;
  undefined8 local_1498;
  IntVect local_1478;
  FillExtDirDummy local_146a;
  GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy> local_1469 [121];
  Geometry *in_stack_ffffffffffffec10;
  Geometry *in_stack_ffffffffffffec18;
  PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
  *in_stack_ffffffffffffec20;
  int in_stack_ffffffffffffec28;
  PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
  *in_stack_ffffffffffffec30;
  int in_stack_ffffffffffffec38;
  IntVect *in_stack_ffffffffffffec40;
  InterpBase *in_stack_ffffffffffffec48;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *in_stack_ffffffffffffec50;
  int in_stack_ffffffffffffec58;
  NullInterpHook<amrex::FArrayBox> *in_stack_ffffffffffffec60;
  NullInterpHook<amrex::FArrayBox> *in_stack_ffffffffffffec68;
  undefined8 local_1380;
  undefined8 local_1378;
  undefined8 uStack_1370;
  undefined8 local_1368;
  undefined8 uStack_1360;
  undefined8 local_1358;
  int in_stack_ffffffffffffedc0;
  Geometry *in_stack_ffffffffffffedc8;
  PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
  *in_stack_ffffffffffffedd0;
  int in_stack_ffffffffffffedd8;
  int local_11bc;
  int iStack_11b8;
  BATType local_11b4;
  BARef *local_11b0;
  BATType local_11a8;
  int local_11a0 [3];
  undefined8 local_1190;
  int local_1188;
  int local_1180 [3];
  undefined8 local_1170;
  int local_1168;
  undefined1 local_1160 [24];
  IntVect local_1148;
  FillExtDirDummy local_113a;
  GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy> local_1139;
  undefined1 local_1138 [238];
  FillExtDirDummy local_104a;
  GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy> local_1049;
  Geometry local_1048;
  FabArray<amrex::FArrayBox> *local_f60;
  _func_int **local_f58;
  BATType local_f50;
  int local_f48 [3];
  undefined8 local_f38;
  int local_f30;
  int local_f28 [3];
  undefined8 local_f18;
  int local_f10;
  undefined1 local_f08 [16];
  IntVect local_ef8;
  FillExtDirDummy local_eea;
  GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy> local_ee9;
  undefined1 local_ee8 [238];
  FillExtDirDummy local_dfa;
  GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy> local_df9;
  Geometry local_df8;
  undefined8 local_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_ce8;
  undefined8 local_af0;
  undefined8 *local_ae8;
  undefined8 local_ae0;
  MultiFab *local_ab8;
  MultiFab **local_ab0;
  undefined8 local_aa8;
  IntVect local_a88;
  FillExtDirDummy local_a7a;
  GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy> local_a79 [233];
  undefined8 local_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  int local_7e0 [2];
  int local_7d8;
  int local_7cc;
  int iStack_7c8;
  int local_7c4;
  Array4<const_double> *local_7c0;
  int local_7b8;
  int local_7b0 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a0;
  undefined1 local_780 [32];
  int local_760;
  undefined1 local_75a [16];
  FillExtDirDummy local_74a;
  GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy> local_749;
  undefined1 local_748 [238];
  FillExtDirDummy local_65a;
  GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy> local_659;
  Geometry local_658;
  FabArray<amrex::FArrayBox> *local_570;
  undefined8 local_560;
  undefined8 *local_558;
  undefined8 local_550;
  MultiFab *local_528;
  MultiFab **local_520;
  undefined8 local_518;
  IntVect local_4f8;
  FillExtDirDummy local_4ea;
  GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy> local_4e9 [233];
  int local_400 [2];
  BATType local_3f8;
  BATType local_3ec;
  BATType BStack_3e8;
  BATType local_3e4;
  _func_int **local_3e0;
  BATType local_3d8;
  int local_3d0 [3];
  undefined8 local_3c0;
  int local_3b8;
  int local_3b0 [3];
  undefined8 local_3a0;
  int local_398;
  undefined1 local_390 [200];
  char *local_2c8;
  RefID local_2c0;
  BATType local_2b8;
  undefined8 *local_2b0;
  undefined8 *local_2a8;
  BARef *local_29c;
  BATType local_294;
  _func_int **local_290;
  BATType local_288;
  pointer local_280;
  pointer local_278;
  _func_int **local_26c;
  BATType local_264;
  MultiArray4<const_double> local_260;
  int local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_250;
  pointer local_248;
  Array4<const_double> *local_23c;
  int local_234;
  _func_int **local_230;
  BATType local_228;
  __uniq_ptr_impl<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
  local_220;
  __uniq_ptr_impl<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
  local_218;
  _func_int **local_20c;
  BATType local_204;
  int *local_200;
  undefined1 *local_1f8;
  int *local_1f0;
  undefined1 *local_1e8;
  BATType *local_1e0;
  undefined1 *local_1d8;
  int local_1d0 [2];
  BATType local_1c8;
  IntVect local_1bc;
  int local_1b0 [2];
  int local_1a8;
  IntVect local_19c;
  int local_190 [2];
  BATType local_188;
  IntVect local_180;
  BATType local_174;
  undefined1 *local_170;
  char *local_168;
  undefined4 local_15c;
  BATType *local_158;
  undefined4 local_14c;
  BATType *local_148;
  undefined4 local_13c;
  BATType *local_138;
  undefined4 local_12c;
  int *local_128;
  undefined4 local_11c;
  int *local_118;
  undefined4 local_10c;
  int *local_108;
  undefined4 local_fc;
  int *local_f8;
  undefined4 local_ec;
  int *local_e8;
  undefined4 local_dc;
  int *local_d8;
  undefined4 local_cc;
  __uniq_ptr_impl<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
  local_c8;
  undefined4 local_bc;
  _Tuple_impl<0UL,_amrex::PCData<amrex::FArrayBox>_*,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
  local_b8;
  undefined4 local_ac;
  PCData<amrex::FArrayBox> *local_a8;
  undefined4 local_9c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  undefined4 local_8c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  undefined4 local_7c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  undefined4 local_6c;
  pointer local_68;
  undefined4 local_5c;
  pointer local_58;
  undefined4 local_4c;
  pointer local_48;
  undefined4 local_3c;
  undefined8 *local_38;
  undefined4 local_2c;
  undefined8 *local_28;
  undefined4 local_1c;
  undefined8 *local_18;
  
  local_390._76_4_ = in_R9D;
  local_390._88_8_ = in_RDX;
  local_390._100_4_ = in_ESI;
  std::allocator<amrex::BCRec>::allocator((allocator<amrex::BCRec> *)0xe3ebe5);
  amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
            (in_stack_ffffffffffffe3b0,(size_type)in_stack_ffffffffffffe3a8,
             (allocator_type *)0xe3ec02);
  std::allocator<amrex::BCRec>::~allocator((allocator<amrex::BCRec> *)0xe3ec11);
  for (local_390._24_4_ = 0; iVar15 = (int)((ulong)in_stack_ffffffffffffe5d0 >> 0x20),
      (int)local_390._24_4_ < 3; local_390._24_4_ = local_390._24_4_ + 1) {
    bVar9 = amrex::Geometry::isPeriodic((Geometry *)local_390._88_8_,local_390._24_4_);
    if (bVar9) {
      for (local_390._20_4_ = 0; (int)local_390._20_4_ < (int)local_390._76_4_;
          local_390._20_4_ = local_390._20_4_ + 1) {
        local_390._136_8_ =
             amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::operator[]
                       (in_stack_ffffffffffffe3b0,(size_type)in_stack_ffffffffffffe3a8);
        local_390._132_4_ = local_390._24_4_;
        local_390._128_4_ = 0;
        ((BCRec *)local_390._136_8_)->bc[(int)local_390._24_4_] = 0;
        local_390._168_8_ =
             amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::operator[]
                       (in_stack_ffffffffffffe3b0,(size_type)in_stack_ffffffffffffe3a8);
        local_390._164_4_ = local_390._24_4_;
        local_390._160_4_ = 0;
        ((BCRec *)local_390._168_8_)->bc[local_390._24_4_ + 3] = 0;
      }
    }
    else {
      for (local_390._16_4_ = 0; (int)local_390._16_4_ < (int)local_390._76_4_;
          local_390._16_4_ = local_390._16_4_ + 1) {
        local_390._120_8_ =
             amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::operator[]
                       (in_stack_ffffffffffffe3b0,(size_type)in_stack_ffffffffffffe3a8);
        local_390._116_4_ = local_390._24_4_;
        local_390._112_4_ = 2;
        *(undefined4 *)(local_390._120_8_ + 0x18 + -0x18 + (long)(int)local_390._24_4_ * 4) = 2;
        local_390._152_8_ =
             amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::operator[]
                       (in_stack_ffffffffffffe3b0,(size_type)in_stack_ffffffffffffe3a8);
        local_390._148_4_ = local_390._24_4_;
        local_390._144_4_ = 2;
        ((BCRec *)local_390._152_8_)->bc[local_390._24_4_ + 3] = 2;
      }
    }
  }
  if (local_390._100_4_ == 0) {
    pGVar10 = amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                        ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                         in_stack_ffffffffffffe3b0,(size_type)in_stack_ffffffffffffe3a8);
    amrex::Geometry::ProbDomain(pGVar10);
    amrex::Geometry::ProbDomain((Geometry *)local_390._88_8_);
    bVar9 = amrex::RealBox::contains
                      ((RealBox *)CONCAT44(in_stack_ffffffffffffe3c4,in_stack_ffffffffffffe3c0),
                       (RealBox *)in_stack_ffffffffffffe3b8,(Real)in_stack_ffffffffffffe3b0);
    if (!bVar9) {
      local_2c8 = "m_geoms[0].ProbDomain().contains(a_level_geom.ProbDomain(), 0.0000001)";
      local_390._192_8_ =
           "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/PelePhysics/Utility/PltFileManager/PltFileManager.cpp"
      ;
      local_390._188_4_ = 0xd3;
      local_390._176_8_ = 0;
      amrex::Assert_host((char *)CONCAT44(in_stack_ffffffffffffe5e4,in_stack_ffffffffffffe5e0),
                         (char *)CONCAT44(in_stack_ffffffffffffe5dc,in_stack_ffffffffffffe5d8),
                         iVar15,in_stack_ffffffffffffe5c8);
    }
    amrex::Geometry::Domain((Geometry *)local_390._88_8_);
    IVar19 = amrex::Box::size((Box *)in_stack_ffffffffffffe3b8);
    local_3b0[2] = IVar19.vect[2];
    local_398 = local_3b0[2];
    local_3b0._0_8_ = IVar19.vect._0_8_;
    local_3a0._0_4_ = local_3b0[0];
    local_3a0._4_4_ = local_3b0[1];
    local_3b0 = IVar19.vect;
    pGVar10 = amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                        ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                         in_stack_ffffffffffffe3b0,(size_type)in_stack_ffffffffffffe3a8);
    amrex::Geometry::Domain(pGVar10);
    IVar19 = amrex::Box::size((Box *)in_stack_ffffffffffffe3b8);
    local_3d0[2] = IVar19.vect[2];
    local_3b8 = local_3d0[2];
    local_3d0._0_8_ = IVar19.vect._0_8_;
    local_3c0._0_4_ = local_3d0[0];
    local_3c0._4_4_ = local_3d0[1];
    uVar7 = local_3c0;
    local_218._M_t.
    super__Tuple_impl<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
    .super__Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false>._M_head_impl =
         (tuple<amrex::FabArray<amrex::FArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
          )&local_3a0;
    local_220._M_t.
    super__Tuple_impl<0UL,_amrex::PCData<amrex::FArrayBox>_*,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
    .super__Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false>._M_head_impl =
         (tuple<amrex::PCData<amrex::FArrayBox>_*,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
          )&local_3c0;
    local_ac = 0;
    local_3c0._0_4_ = IVar19.vect[0];
    iVar17 = (int)local_3a0 / (int)local_3c0;
    local_bc = 1;
    local_3c0._4_4_ = IVar19.vect[1];
    iVar15 = local_3a0._4_4_ / local_3c0._4_4_;
    local_cc = 2;
    iVar16 = local_398 / local_3d0[2];
    local_3d0 = IVar19.vect;
    local_3c0 = uVar7;
    local_c8._M_t.
    super__Tuple_impl<0UL,_amrex::PCData<amrex::FArrayBox>_*,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
    .super__Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false>._M_head_impl =
         local_220._M_t.
         super__Tuple_impl<0UL,_amrex::PCData<amrex::FArrayBox>_*,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
         .super__Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false>._M_head_impl;
    local_b8.super__Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false>._M_head_impl =
         (_Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false>)
         (_Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false>)
         local_220._M_t.
         super__Tuple_impl<0UL,_amrex::PCData<amrex::FArrayBox>_*,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
         .super__Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false>._M_head_impl;
    local_a8 = (PCData<amrex::FArrayBox> *)
               local_220._M_t.
               super__Tuple_impl<0UL,_amrex::PCData<amrex::FArrayBox>_*,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false>._M_head_impl;
    amrex::IntVect::IntVect((IntVect *)&local_20c,iVar17,iVar15,iVar16);
    local_228 = local_204;
    local_230 = local_20c;
    local_3d8 = local_204;
    local_3e0 = local_20c;
    local_390._8_4_ = local_204;
    local_390._0_8_ = local_20c;
    amrex::IntVect::IntVect(&local_180,1);
    local_188 = local_180.vect[2];
    local_190[0] = local_180.vect[0];
    local_190[1] = local_180.vect[1];
    local_3f8 = local_180.vect[2];
    local_400[0] = local_180.vect[0];
    local_400[1] = local_180.vect[1];
    local_3ec = local_180.vect[0];
    BStack_3e8 = local_180.vect[1];
    uVar7 = _local_3ec;
    local_3e4 = local_180.vect[2];
    local_1d8 = local_390;
    local_1e0 = &local_3ec;
    local_13c = 0;
    local_3ec = local_180.vect[0];
    bVar9 = false;
    if (local_390._0_4_ == local_3ec) {
      local_14c = 1;
      BStack_3e8 = local_180.vect[1];
      bVar9 = false;
      local_148 = local_1e0;
      if (local_390._4_4_ == BStack_3e8) {
        local_15c = 2;
        bVar9 = local_390._8_4_ == local_180.vect[2];
        local_158 = local_1e0;
      }
    }
    _local_3ec = uVar7;
    local_138 = local_1e0;
    if (bVar9) {
      amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>::GpuBndryFuncFab
                (local_4e9,&local_4ea);
      amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>::
      PhysBCFunct((PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
                   *)CONCAT44(in_stack_ffffffffffffe3c4,in_stack_ffffffffffffe3c0),
                  in_stack_ffffffffffffe3b8,in_stack_ffffffffffffe3b0,in_stack_ffffffffffffe3a8);
      amrex::IntVect::IntVect(&local_4f8,0);
      local_528 = amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                            ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                             in_stack_ffffffffffffe3b0,(size_type)in_stack_ffffffffffffe3a8);
      local_520 = &local_528;
      local_518 = 1;
      std::allocator<amrex::MultiFab_*>::allocator((allocator<amrex::MultiFab_*> *)0xe3f329);
      iVar1._M_len._0_4_ = in_stack_ffffffffffffe3c0;
      iVar1._M_array = (iterator)in_stack_ffffffffffffe3b8;
      iVar1._M_len._4_4_ = in_stack_ffffffffffffe3c4;
      amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
                ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                 in_stack_ffffffffffffe3b0,iVar1,(allocator_type *)in_stack_ffffffffffffe3a8);
      local_560 = 0;
      local_558 = &local_560;
      local_550 = 1;
      std::allocator<double>::allocator((allocator<double> *)0xe3f38d);
      iVar2._M_len._0_4_ = in_stack_ffffffffffffe3c0;
      iVar2._M_array = (iterator)in_stack_ffffffffffffe3b8;
      iVar2._M_len._4_4_ = in_stack_ffffffffffffe3c4;
      amrex::Vector<double,_std::allocator<double>_>::vector
                ((Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe3b0,iVar2,
                 (allocator_type *)in_stack_ffffffffffffe3a8);
      amrex::
      FillPatchSingleLevel<amrex::MultiFab,amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>>>
                (in_stack_ffffffffffffea18,in_stack_ffffffffffffea10,in_stack_ffffffffffffea08,
                 in_stack_ffffffffffffea00,
                 (Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe9f8,
                 in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0,in_stack_ffffffffffffedc0,
                 in_stack_ffffffffffffedc8,in_stack_ffffffffffffedd0,in_stack_ffffffffffffedd8);
      amrex::Vector<double,_std::allocator<double>_>::~Vector
                ((Vector<double,_std::allocator<double>_> *)0xe3f426);
      std::allocator<double>::~allocator((allocator<double> *)0xe3f433);
      amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
                ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0xe3f440);
      std::allocator<amrex::MultiFab_*>::~allocator((allocator<amrex::MultiFab_*> *)0xe3f44d);
      amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>::
      ~PhysBCFunct((PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
                    *)0xe3f45a);
    }
    else {
      local_170 = local_390;
      if ((int)local_390._4_4_ < (int)local_390._0_4_) {
        local_195c = local_390._0_4_;
      }
      else {
        local_195c = local_390._4_4_;
      }
      local_174 = local_195c;
      if ((int)local_390._8_4_ < (int)local_195c) {
        local_1960 = local_195c;
      }
      else {
        local_1960 = local_390._8_4_;
      }
      if ((int)local_1960 < 2) {
        local_168 = 
        "When initializing dataFromPlt, our level 0 can\'t be coarser than the PltFile one";
        amrex::Abort_host((char *)CONCAT44(in_stack_ffffffffffffe3c4,in_stack_ffffffffffffe3c0));
      }
      else {
        local_570 = (FabArray<amrex::FArrayBox> *)amrex::mf_cell_cons_interp;
        amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                  ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                   in_stack_ffffffffffffe3b0,(size_type)in_stack_ffffffffffffe3a8);
        amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>::GpuBndryFuncFab
                  (&local_659,&local_65a);
        amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
        ::PhysBCFunct((PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
                       *)CONCAT44(in_stack_ffffffffffffe3c4,in_stack_ffffffffffffe3c0),
                      in_stack_ffffffffffffe3b8,in_stack_ffffffffffffe3b0,in_stack_ffffffffffffe3a8)
        ;
        amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>::GpuBndryFuncFab
                  (&local_749,&local_74a);
        amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
        ::PhysBCFunct((PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
                       *)CONCAT44(in_stack_ffffffffffffe3c4,in_stack_ffffffffffffe3c0),
                      in_stack_ffffffffffffe3b8,in_stack_ffffffffffffe3b0,in_stack_ffffffffffffe3a8)
        ;
        amrex::IntVect::IntVect((IntVect *)(local_75a + 2),0);
        amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                  ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                   in_stack_ffffffffffffe3b0,(size_type)in_stack_ffffffffffffe3a8);
        pGVar11 = amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                            ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                             in_stack_ffffffffffffe3b0,(size_type)in_stack_ffffffffffffe3a8);
        pFVar28 = (FabFactory<amrex::FArrayBox> *)local_75a;
        pBVar26 = (BoxArray *)(local_390 + 0x30);
        pFVar24 = (FabArray<amrex::FArrayBox> *)local_390;
        puVar23 = local_748;
        pGVar10 = &local_658;
        CVar27 = COPY;
        iVar15 = 0;
        uVar22 = 0;
        pGVar21 = (Geometry *)local_390._88_8_;
        pFVar25 = local_570;
        amrex::
        InterpFromCoarseLevel<amrex::MultiFab,amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>>,amrex::InterpBase,amrex::NullInterpHook<amrex::FArrayBox>,amrex::NullInterpHook<amrex::FArrayBox>>
                  (in_stack_ffffffffffffe9f8,
                   (IntVect *)CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0),
                   in_stack_ffffffffffffe9e8,in_stack_ffffffffffffe9e0,in_stack_ffffffffffffe9dc,
                   in_stack_ffffffffffffe9d8,in_stack_ffffffffffffe9d4,in_stack_ffffffffffffec10,
                   in_stack_ffffffffffffec18,in_stack_ffffffffffffec20,in_stack_ffffffffffffec28,
                   in_stack_ffffffffffffec30,in_stack_ffffffffffffec38,in_stack_ffffffffffffec40,
                   in_stack_ffffffffffffec48,in_stack_ffffffffffffec50,in_stack_ffffffffffffec58,
                   in_stack_ffffffffffffec60,in_stack_ffffffffffffec68);
        amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
        ::~PhysBCFunct((PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
                        *)0xe3f7c0);
        amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
        ::~PhysBCFunct((PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
                        *)0xe3f7cd);
        local_760 = 1;
        while( true ) {
          iVar16 = (int)((ulong)puVar23 >> 0x20);
          lVar12 = (long)local_760;
          LVar13 = amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::size
                             ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)0xe3f7f9)
          ;
          if (LVar13 <= lVar12) break;
          amrex::Geometry::Domain((Geometry *)local_390._88_8_);
          local_7a0.field_2._0_12_ = (undefined1  [12])amrex::Box::size((Box *)pGVar10);
          local_780._8_4_ = local_7a0.field_2._8_4_;
          local_780._0_8_ = local_7a0.field_2._M_allocated_capacity;
          pGVar14 = amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                              ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)pGVar21,
                               (size_type)pGVar11);
          amrex::Geometry::Domain(pGVar14);
          local_7b0 = (int  [3])amrex::Box::size((Box *)pGVar10);
          local_7a0._M_string_length._0_4_ = local_7b0[2];
          local_7a0._0_8_ = local_7b0._0_8_;
          uVar7 = local_7a0._0_8_;
          local_248 = (pointer)local_780;
          local_250 = &local_7a0;
          local_7c = 0;
          local_7a0._0_4_ = local_7b0[0];
          iVar18 = (int)local_780._0_4_ / (int)local_7a0._0_4_;
          local_8c = 1;
          local_7a0._4_4_ = local_7b0[1];
          iVar17 = (int)local_780._4_4_ / (int)local_7a0._4_4_;
          local_9c = 2;
          local_7a0._0_8_ = uVar7;
          local_98 = local_250;
          local_88 = local_250;
          local_78 = local_250;
          amrex::IntVect::IntVect
                    ((IntVect *)&local_23c,iVar18,iVar17,(int)local_780._8_4_ / local_7b0[2]);
          local_258 = local_234;
          local_260.hp = local_23c;
          local_7b8 = local_234;
          local_7c0 = local_23c;
          local_780._24_4_ = local_234;
          local_780._16_8_ = local_23c;
          amrex::IntVect::IntVect(&local_19c,1);
          local_1a8 = local_19c.vect[2];
          local_1b0[0] = local_19c.vect[0];
          local_1b0[1] = local_19c.vect[1];
          local_7d8 = local_19c.vect[2];
          local_7e0[0] = local_19c.vect[0];
          local_7e0[1] = local_19c.vect[1];
          local_7cc = local_19c.vect[0];
          iStack_7c8 = local_19c.vect[1];
          uVar7 = _local_7cc;
          local_7c4 = local_19c.vect[2];
          local_1e8 = local_780 + 0x10;
          local_1f0 = &local_7cc;
          local_10c = 0;
          local_7cc = local_19c.vect[0];
          bVar9 = false;
          if (local_780._16_4_ == local_7cc) {
            local_11c = 1;
            iStack_7c8 = local_19c.vect[1];
            bVar9 = false;
            local_118 = local_1f0;
            if (local_780._20_4_ == iStack_7c8) {
              local_12c = 2;
              bVar9 = local_780._24_4_ == local_19c.vect[2];
              local_128 = local_1f0;
            }
          }
          _local_7cc = uVar7;
          local_108 = local_1f0;
          if (bVar9) {
            amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                      ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)pGVar21,
                       (size_type)pGVar11);
            amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::
            operator[]((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                        *)pGVar21,(size_type)pGVar11);
            local_978 = 0;
            uStack_970 = 0;
            local_988 = 0;
            uStack_980 = 0;
            local_968 = 0;
            amrex::MFInfo::MFInfo((MFInfo *)0xe3fbf4);
            local_990 = 0;
            pGVar20 = (GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy> *)&local_990;
            amrex::DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
                      ((DefaultFabFactory<amrex::FArrayBox> *)pGVar21);
            amrex::MultiFab::MultiFab
                      ((MultiFab *)CONCAT44(in_stack_ffffffffffffe3f4,CVar27),pBVar26,
                       (DistributionMapping *)pFVar25,(int)((ulong)pFVar24 >> 0x20),(int)pFVar24,
                       (MFInfo *)CONCAT44(in_stack_ffffffffffffe3d4,iVar15),pFVar28);
            amrex::DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
                      ((DefaultFabFactory<amrex::FArrayBox> *)0xe3fc61);
            amrex::MFInfo::~MFInfo((MFInfo *)0xe3fc6e);
            amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                      ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)pGVar21,
                       (size_type)pGVar20);
            amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>::GpuBndryFuncFab
                      (local_a79,&local_a7a);
            amrex::
            PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>::
            PhysBCFunct((PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
                         *)CONCAT44(in_stack_ffffffffffffe3c4,uVar22),pGVar10,
                        (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)pGVar21,pGVar20);
            amrex::IntVect::IntVect(&local_a88,0);
            local_ab8 = amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                                  ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                                   pGVar21,(size_type)pGVar20);
            local_ab0 = &local_ab8;
            local_aa8 = 1;
            std::allocator<amrex::MultiFab_*>::allocator((allocator<amrex::MultiFab_*> *)0xe3fd31);
            iVar3._M_len._0_4_ = uVar22;
            iVar3._M_array = (iterator)pGVar10;
            iVar3._M_len._4_4_ = in_stack_ffffffffffffe3c4;
            amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
                      ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)pGVar21,
                       iVar3,(allocator_type *)pGVar20);
            local_af0 = 0;
            local_ae8 = &local_af0;
            local_ae0 = 1;
            std::allocator<double>::allocator((allocator<double> *)0xe3fd95);
            iVar4._M_len._0_4_ = uVar22;
            iVar4._M_array = (iterator)pGVar10;
            iVar4._M_len._4_4_ = in_stack_ffffffffffffe3c4;
            amrex::Vector<double,_std::allocator<double>_>::vector
                      ((Vector<double,_std::allocator<double>_> *)pGVar21,iVar4,
                       (allocator_type *)pGVar20);
            amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                      ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)pGVar21,
                       (size_type)pGVar20);
            uVar22 = 0;
            amrex::
            FillPatchSingleLevel<amrex::MultiFab,amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>>>
                      (in_stack_ffffffffffffea18,in_stack_ffffffffffffea10,in_stack_ffffffffffffea08
                       ,in_stack_ffffffffffffea00,
                       (Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe9f8,
                       in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0,in_stack_ffffffffffffedc0
                       ,in_stack_ffffffffffffedc8,in_stack_ffffffffffffedd0,
                       in_stack_ffffffffffffedd8);
            amrex::Vector<double,_std::allocator<double>_>::~Vector
                      ((Vector<double,_std::allocator<double>_> *)0xe3fe59);
            std::allocator<double>::~allocator((allocator<double> *)0xe3fe66);
            amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
                      ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0xe3fe73);
            std::allocator<amrex::MultiFab_*>::~allocator((allocator<amrex::MultiFab_*> *)0xe3fe80);
            amrex::Periodicity::NonPeriodic();
            amrex::FabArray<amrex::FArrayBox>::ParallelCopy
                      (pFVar25,pFVar24,in_stack_ffffffffffffe3d4,iVar15,iVar16,
                       (Periodicity *)CONCAT44(in_stack_ffffffffffffe3c4,uVar22),CVar27);
            amrex::
            PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>::
            ~PhysBCFunct((PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
                          *)0xe3fef2);
            amrex::MultiFab::~MultiFab((MultiFab *)0xe3feff);
            break;
          }
          amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                    ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)pGVar21,
                     (size_type)pGVar11);
          amrex::refine((BoxArray *)pFVar24,(IntVect *)CONCAT44(in_stack_ffffffffffffe3d4,iVar15));
          amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::
          operator[]((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                      *)pGVar21,(size_type)pGVar11);
          local_cf8 = 0;
          uStack_cf0 = 0;
          local_d08 = 0;
          uStack_d00 = 0;
          local_ce8 = 0;
          amrex::MFInfo::MFInfo((MFInfo *)0xe400db);
          local_d10 = 0;
          pGVar20 = (GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy> *)&local_d10;
          amrex::DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
                    ((DefaultFabFactory<amrex::FArrayBox> *)pGVar21);
          amrex::MultiFab::MultiFab
                    ((MultiFab *)CONCAT44(in_stack_ffffffffffffe3f4,CVar27),pBVar26,
                     (DistributionMapping *)pFVar25,(int)((ulong)pFVar24 >> 0x20),(int)pFVar24,
                     (MFInfo *)CONCAT44(in_stack_ffffffffffffe3d4,iVar15),pFVar28);
          amrex::DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
                    ((DefaultFabFactory<amrex::FArrayBox> *)0xe40148);
          amrex::MFInfo::~MFInfo((MFInfo *)0xe40155);
          amrex::BoxArray::~BoxArray((BoxArray *)pGVar21);
          amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                    ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)pGVar21,
                     (size_type)pGVar20);
          amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>::GpuBndryFuncFab
                    (&local_df9,&local_dfa);
          amrex::
          PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>::
          PhysBCFunct((PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
                       *)CONCAT44(in_stack_ffffffffffffe3c4,uVar22),pGVar10,
                      (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)pGVar21,pGVar20);
          amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>::GpuBndryFuncFab
                    (&local_ee9,&local_eea);
          amrex::
          PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>::
          PhysBCFunct((PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
                       *)CONCAT44(in_stack_ffffffffffffe3c4,uVar22),pGVar10,
                      (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)pGVar21,pGVar20);
          amrex::IntVect::IntVect(&local_ef8,0);
          amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                    ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)pGVar21,
                     (size_type)pGVar20);
          pGVar11 = amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                              ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)pGVar21,
                               (size_type)pGVar20);
          pFVar28 = (FabFactory<amrex::FArrayBox> *)(local_f08 + 0xe);
          pBVar26 = (BoxArray *)(local_390 + 0x30);
          pFVar24 = (FabArray<amrex::FArrayBox> *)(local_780 + 0x10);
          puVar23 = local_ee8;
          pGVar10 = &local_df8;
          CVar27 = COPY;
          iVar15 = 0;
          uVar22 = 0;
          pGVar21 = (Geometry *)local_390._88_8_;
          pFVar25 = local_570;
          amrex::
          InterpFromCoarseLevel<amrex::MultiFab,amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>>,amrex::InterpBase,amrex::NullInterpHook<amrex::FArrayBox>,amrex::NullInterpHook<amrex::FArrayBox>>
                    (in_stack_ffffffffffffe9f8,
                     (IntVect *)CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0),
                     in_stack_ffffffffffffe9e8,in_stack_ffffffffffffe9e0,in_stack_ffffffffffffe9dc,
                     in_stack_ffffffffffffe9d8,in_stack_ffffffffffffe9d4,in_stack_ffffffffffffec10,
                     in_stack_ffffffffffffec18,in_stack_ffffffffffffec20,in_stack_ffffffffffffec28,
                     in_stack_ffffffffffffec30,in_stack_ffffffffffffec38,in_stack_ffffffffffffec40,
                     in_stack_ffffffffffffec48,in_stack_ffffffffffffec50,in_stack_ffffffffffffec58,
                     in_stack_ffffffffffffec60,in_stack_ffffffffffffec68);
          amrex::Periodicity::NonPeriodic();
          pGVar11 = (Geometry *)((ulong)pGVar11 & 0xffffffff00000000);
          amrex::FabArray<amrex::FArrayBox>::ParallelCopy
                    (pFVar25,pFVar24,in_stack_ffffffffffffe3d4,iVar15,(int)((ulong)puVar23 >> 0x20),
                     (Periodicity *)CONCAT44(in_stack_ffffffffffffe3c4,uVar22),CVar27);
          amrex::
          PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>::
          ~PhysBCFunct((PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
                        *)0xe403b7);
          amrex::
          PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>::
          ~PhysBCFunct((PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
                        *)0xe403c4);
          amrex::MultiFab::~MultiFab((MultiFab *)0xe403d1);
          local_760 = local_760 + 1;
        }
      }
    }
  }
  else {
    amrex::Geometry::Domain((Geometry *)local_390._88_8_);
    local_f28 = (int  [3])amrex::Box::size((Box *)in_stack_ffffffffffffe3b8);
    local_f10 = local_f28[2];
    local_f18 = (FArrayBox *)local_f28._0_8_;
    pGVar10 = amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                        ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                         in_stack_ffffffffffffe3b0,(size_type)in_stack_ffffffffffffe3a8);
    amrex::Geometry::Domain(pGVar10);
    local_f48 = (int  [3])amrex::Box::size((Box *)in_stack_ffffffffffffe3b8);
    local_f30 = local_f48[2];
    local_f38 = (FArrayBox *)local_f48._0_8_;
    pFVar8 = local_f38;
    local_278 = (pointer)&local_f18;
    local_280 = (pointer)&local_f38;
    local_4c = 0;
    local_f38._0_4_ = local_f48[0];
    iVar16 = (int)local_f18 / (int)local_f38;
    local_5c = 1;
    local_f38._4_4_ = local_f48[1];
    iVar15 = local_f18._4_4_ / local_f38._4_4_;
    local_6c = 2;
    local_f38 = pFVar8;
    local_68 = local_280;
    local_58 = local_280;
    local_48 = local_280;
    amrex::IntVect::IntVect((IntVect *)&local_26c,iVar16,iVar15,local_f10 / local_f48[2]);
    local_288 = local_264;
    local_290 = local_26c;
    local_f50 = local_264;
    local_f58 = local_26c;
    local_f08._8_4_ = local_264;
    local_f08._0_8_ = local_26c;
    local_f60 = (FabArray<amrex::FArrayBox> *)amrex::mf_cell_cons_interp;
    amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
              ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
               in_stack_ffffffffffffe3b0,(size_type)in_stack_ffffffffffffe3a8);
    amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>::GpuBndryFuncFab
              (&local_1049,&local_104a);
    amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>::
    PhysBCFunct((PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
                 *)CONCAT44(in_stack_ffffffffffffe3c4,in_stack_ffffffffffffe3c0),
                in_stack_ffffffffffffe3b8,in_stack_ffffffffffffe3b0,in_stack_ffffffffffffe3a8);
    amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>::GpuBndryFuncFab
              (&local_1139,&local_113a);
    amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>::
    PhysBCFunct((PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
                 *)CONCAT44(in_stack_ffffffffffffe3c4,in_stack_ffffffffffffe3c0),
                in_stack_ffffffffffffe3b8,in_stack_ffffffffffffe3b0,in_stack_ffffffffffffe3a8);
    amrex::IntVect::IntVect(&local_1148,0);
    amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
              ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
               in_stack_ffffffffffffe3b0,(size_type)in_stack_ffffffffffffe3a8);
    pGVar11 = amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                        ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                         in_stack_ffffffffffffe3b0,(size_type)in_stack_ffffffffffffe3a8);
    pFVar28 = (FabFactory<amrex::FArrayBox> *)(local_1160 + 0x16);
    pBVar26 = (BoxArray *)(local_390 + 0x30);
    pFVar24 = (FabArray<amrex::FArrayBox> *)local_f08;
    puVar23 = local_1138;
    pGVar10 = &local_1048;
    CVar27 = COPY;
    iVar15 = 0;
    uVar22 = 0;
    pGVar21 = (Geometry *)local_390._88_8_;
    pFVar25 = local_f60;
    amrex::
    InterpFromCoarseLevel<amrex::MultiFab,amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>>,amrex::InterpBase,amrex::NullInterpHook<amrex::FArrayBox>,amrex::NullInterpHook<amrex::FArrayBox>>
              (in_stack_ffffffffffffe9f8,
               (IntVect *)CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0),
               in_stack_ffffffffffffe9e8,in_stack_ffffffffffffe9e0,in_stack_ffffffffffffe9dc,
               in_stack_ffffffffffffe9d8,in_stack_ffffffffffffe9d4,in_stack_ffffffffffffec10,
               in_stack_ffffffffffffec18,in_stack_ffffffffffffec20,in_stack_ffffffffffffec28,
               in_stack_ffffffffffffec30,in_stack_ffffffffffffec38,in_stack_ffffffffffffec40,
               in_stack_ffffffffffffec48,in_stack_ffffffffffffec50,in_stack_ffffffffffffec58,
               in_stack_ffffffffffffec60,in_stack_ffffffffffffec68);
    amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>::
    ~PhysBCFunct((PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
                  *)0xe408da);
    amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>::
    ~PhysBCFunct((PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
                  *)0xe408e7);
    local_1160._16_4_ = 1;
    while( true ) {
      iVar16 = (int)((ulong)puVar23 >> 0x20);
      lVar12 = (long)(int)local_1160._16_4_;
      LVar13 = amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::size
                         ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)0xe40913);
      if (LVar13 <= lVar12) break;
      amrex::Geometry::Domain((Geometry *)local_390._88_8_);
      IVar19 = amrex::Box::size((Box *)pGVar10);
      local_1180[2] = IVar19.vect[2];
      local_1168 = local_1180[2];
      local_1180._0_8_ = IVar19.vect._0_8_;
      local_1170._0_4_ = local_1180[0];
      local_1170._4_4_ = local_1180[1];
      local_1180 = IVar19.vect;
      pGVar14 = amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                          ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)pGVar21,
                           (size_type)pGVar11);
      amrex::Geometry::Domain(pGVar14);
      IVar19 = amrex::Box::size((Box *)pGVar10);
      local_11a0[2] = IVar19.vect[2];
      local_1188 = local_11a0[2];
      local_11a0._0_8_ = IVar19.vect._0_8_;
      local_1190._0_4_ = local_11a0[0];
      local_1190._4_4_ = local_11a0[1];
      uVar7 = local_1190;
      local_2a8 = &local_1170;
      local_2b0 = &local_1190;
      local_1c = 0;
      local_1190._0_4_ = IVar19.vect[0];
      i = (int)local_1170 / (int)local_1190;
      local_2c = 1;
      local_1190._4_4_ = IVar19.vect[1];
      iVar17 = local_1170._4_4_ / local_1190._4_4_;
      local_3c = 2;
      iVar18 = local_1168 / local_11a0[2];
      local_11a0 = IVar19.vect;
      local_1190 = uVar7;
      local_38 = local_2b0;
      local_28 = local_2b0;
      local_18 = local_2b0;
      amrex::IntVect::IntVect((IntVect *)&local_29c,i,iVar17,iVar18);
      local_2b8 = local_294;
      local_2c0.data = local_29c;
      local_11a8 = local_294;
      local_11b0 = local_29c;
      local_1160._8_4_ = local_294;
      local_1160._0_8_ = local_29c;
      amrex::IntVect::IntVect(&local_1bc,1);
      local_1c8 = local_1bc.vect[2];
      local_1d0[0] = local_1bc.vect[0];
      local_1d0[1] = local_1bc.vect[1];
      local_11bc = local_1bc.vect[0];
      iStack_11b8 = local_1bc.vect[1];
      uVar7 = _local_11bc;
      local_11b4 = local_1bc.vect[2];
      local_1f8 = local_1160;
      local_200 = &local_11bc;
      local_dc = 0;
      local_11bc = local_1bc.vect[0];
      bVar9 = false;
      if (local_1160._0_4_ == local_11bc) {
        local_ec = 1;
        iStack_11b8 = local_1bc.vect[1];
        bVar9 = false;
        local_e8 = local_200;
        if (local_1160._4_4_ == iStack_11b8) {
          local_fc = 2;
          bVar9 = local_1160._8_4_ == local_1bc.vect[2];
          local_f8 = local_200;
        }
      }
      _local_11bc = uVar7;
      local_d8 = local_200;
      if (bVar9) {
        amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                  ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)pGVar21,
                   (size_type)pGVar11);
        amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::
        operator[]((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                    *)pGVar21,(size_type)pGVar11);
        local_1368 = 0;
        uStack_1360 = 0;
        local_1378 = 0;
        uStack_1370 = 0;
        local_1358 = 0;
        amrex::MFInfo::MFInfo((MFInfo *)0xe40d0e);
        local_1380 = 0;
        pGVar20 = (GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy> *)&local_1380;
        amrex::DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
                  ((DefaultFabFactory<amrex::FArrayBox> *)pGVar21);
        amrex::MultiFab::MultiFab
                  ((MultiFab *)CONCAT44(in_stack_ffffffffffffe3f4,CVar27),pBVar26,
                   (DistributionMapping *)pFVar25,(int)((ulong)pFVar24 >> 0x20),(int)pFVar24,
                   (MFInfo *)CONCAT44(in_stack_ffffffffffffe3d4,iVar15),pFVar28);
        amrex::DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
                  ((DefaultFabFactory<amrex::FArrayBox> *)0xe40d7b);
        amrex::MFInfo::~MFInfo((MFInfo *)0xe40d88);
        amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                  ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)pGVar21,
                   (size_type)pGVar20);
        amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>::GpuBndryFuncFab
                  (local_1469,&local_146a);
        amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
        ::PhysBCFunct((PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
                       *)CONCAT44(in_stack_ffffffffffffe3c4,uVar22),pGVar10,
                      (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)pGVar21,pGVar20);
        amrex::IntVect::IntVect(&local_1478,0);
        local_14a8 = amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                               ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)pGVar21
                                ,(size_type)pGVar20);
        local_14a0 = &local_14a8;
        local_1498 = 1;
        std::allocator<amrex::MultiFab_*>::allocator((allocator<amrex::MultiFab_*> *)0xe40e4b);
        iVar5._M_len._0_4_ = uVar22;
        iVar5._M_array = (iterator)pGVar10;
        iVar5._M_len._4_4_ = in_stack_ffffffffffffe3c4;
        amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
                  ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)pGVar21,iVar5,
                   (allocator_type *)pGVar20);
        local_14e0 = 0;
        local_14d8 = &local_14e0;
        local_14d0 = 1;
        std::allocator<double>::allocator((allocator<double> *)0xe40eaf);
        iVar6._M_len._0_4_ = uVar22;
        iVar6._M_array = (iterator)pGVar10;
        iVar6._M_len._4_4_ = in_stack_ffffffffffffe3c4;
        amrex::Vector<double,_std::allocator<double>_>::vector
                  ((Vector<double,_std::allocator<double>_> *)pGVar21,iVar6,
                   (allocator_type *)pGVar20);
        amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                  ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)pGVar21,
                   (size_type)pGVar20);
        uVar22 = 0;
        amrex::
        FillPatchSingleLevel<amrex::MultiFab,amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>>>
                  (in_stack_ffffffffffffea18,in_stack_ffffffffffffea10,in_stack_ffffffffffffea08,
                   in_stack_ffffffffffffea00,
                   (Vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe9f8,
                   in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0,in_stack_ffffffffffffedc0,
                   in_stack_ffffffffffffedc8,in_stack_ffffffffffffedd0,in_stack_ffffffffffffedd8);
        amrex::Vector<double,_std::allocator<double>_>::~Vector
                  ((Vector<double,_std::allocator<double>_> *)0xe40f73);
        std::allocator<double>::~allocator((allocator<double> *)0xe40f80);
        amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
                  ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0xe40f8d);
        std::allocator<amrex::MultiFab_*>::~allocator((allocator<amrex::MultiFab_*> *)0xe40f9a);
        amrex::Periodicity::NonPeriodic();
        amrex::FabArray<amrex::FArrayBox>::ParallelCopy
                  (pFVar25,pFVar24,in_stack_ffffffffffffe3d4,iVar15,iVar16,
                   (Periodicity *)CONCAT44(in_stack_ffffffffffffe3c4,uVar22),CVar27);
        amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
        ::~PhysBCFunct((PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
                        *)0xe4100c);
        amrex::MultiFab::~MultiFab((MultiFab *)0xe41019);
        break;
      }
      amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)pGVar21,
                 (size_type)pGVar11);
      amrex::refine((BoxArray *)pFVar24,(IntVect *)CONCAT44(in_stack_ffffffffffffe3d4,iVar15));
      amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::
      operator[]((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
                 pGVar21,(size_type)pGVar11);
      local_16e8 = 0;
      uStack_16e0 = 0;
      local_16f8 = 0;
      uStack_16f0 = 0;
      local_16d8 = 0;
      amrex::MFInfo::MFInfo((MFInfo *)0xe411f5);
      local_1700 = 0;
      pGVar20 = (GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy> *)&local_1700;
      amrex::DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
                ((DefaultFabFactory<amrex::FArrayBox> *)pGVar21);
      amrex::MultiFab::MultiFab
                ((MultiFab *)CONCAT44(in_stack_ffffffffffffe3f4,CVar27),pBVar26,
                 (DistributionMapping *)pFVar25,(int)((ulong)pFVar24 >> 0x20),(int)pFVar24,
                 (MFInfo *)CONCAT44(in_stack_ffffffffffffe3d4,iVar15),pFVar28);
      amrex::DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
                ((DefaultFabFactory<amrex::FArrayBox> *)0xe41262);
      amrex::MFInfo::~MFInfo((MFInfo *)0xe4126f);
      amrex::BoxArray::~BoxArray((BoxArray *)pGVar21);
      amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)pGVar21,
                 (size_type)pGVar20);
      amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>::GpuBndryFuncFab
                (&local_17e9,&local_17ea);
      amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>::
      PhysBCFunct((PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
                   *)CONCAT44(in_stack_ffffffffffffe3c4,uVar22),pGVar10,
                  (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)pGVar21,pGVar20);
      amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>::GpuBndryFuncFab
                (&local_18d9,&local_18da);
      amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>::
      PhysBCFunct((PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
                   *)CONCAT44(in_stack_ffffffffffffe3c4,uVar22),pGVar10,
                  (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)pGVar21,pGVar20);
      amrex::IntVect::IntVect((IntVect *)(local_18ea + 2),0);
      amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)pGVar21,
                 (size_type)pGVar20);
      pGVar11 = amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                          ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)pGVar21,
                           (size_type)pGVar20);
      pFVar28 = (FabFactory<amrex::FArrayBox> *)local_18ea;
      pBVar26 = (BoxArray *)(local_390 + 0x30);
      pFVar24 = (FabArray<amrex::FArrayBox> *)local_1160;
      puVar23 = local_18d8;
      pGVar10 = &local_17e8;
      CVar27 = COPY;
      iVar15 = 0;
      uVar22 = 0;
      pGVar21 = (Geometry *)local_390._88_8_;
      pFVar25 = local_f60;
      amrex::
      InterpFromCoarseLevel<amrex::MultiFab,amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>>,amrex::InterpBase,amrex::NullInterpHook<amrex::FArrayBox>,amrex::NullInterpHook<amrex::FArrayBox>>
                (in_stack_ffffffffffffe9f8,
                 (IntVect *)CONCAT44(in_stack_ffffffffffffe9f4,in_stack_ffffffffffffe9f0),
                 in_stack_ffffffffffffe9e8,in_stack_ffffffffffffe9e0,in_stack_ffffffffffffe9dc,
                 in_stack_ffffffffffffe9d8,in_stack_ffffffffffffe9d4,in_stack_ffffffffffffec10,
                 in_stack_ffffffffffffec18,in_stack_ffffffffffffec20,in_stack_ffffffffffffec28,
                 in_stack_ffffffffffffec30,in_stack_ffffffffffffec38,in_stack_ffffffffffffec40,
                 in_stack_ffffffffffffec48,in_stack_ffffffffffffec50,in_stack_ffffffffffffec58,
                 in_stack_ffffffffffffec60,in_stack_ffffffffffffec68);
      amrex::Periodicity::NonPeriodic();
      pGVar11 = (Geometry *)((ulong)pGVar11 & 0xffffffff00000000);
      amrex::FabArray<amrex::FArrayBox>::ParallelCopy
                (pFVar25,pFVar24,in_stack_ffffffffffffe3d4,iVar15,(int)((ulong)puVar23 >> 0x20),
                 (Periodicity *)CONCAT44(in_stack_ffffffffffffe3c4,uVar22),CVar27);
      amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>::
      ~PhysBCFunct((PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
                    *)0xe414b9);
      amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>::
      ~PhysBCFunct((PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
                    *)0xe414c6);
      amrex::MultiFab::~MultiFab((MultiFab *)0xe414d3);
      local_1160._16_4_ = local_1160._16_4_ + 1;
    }
  }
  amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~Vector
            ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0xe415a1);
  return;
}

Assistant:

void
PltFileManager::fillPatchFromPlt(
  int a_lev,
  const Geometry& a_level_geom,
  int pltComp,
  int dataComp,
  int nComp,
  MultiFab& a_mf)
{
  Vector<BCRec> dummyBCRec(nComp);
  for (int idim = 0; idim < AMREX_SPACEDIM; idim++) {
    if (a_level_geom.isPeriodic(idim)) {
      for (int n = 0; n < nComp; n++) {
        dummyBCRec[n].setLo(idim, BCType::int_dir);
        dummyBCRec[n].setHi(idim, BCType::int_dir);
      }
    } else {
      for (int n = 0; n < nComp; n++) {
        dummyBCRec[n].setLo(idim, BCType::foextrap);
        dummyBCRec[n].setHi(idim, BCType::foextrap);
      }
    }
  }

  // There might be a number of problems related to proper nesting of the
  // current BA and the PltFile BA. Try to address some of those, but need
  // further testing.

  if (a_lev == 0) {
    // Ensure that the provided level 0 geometry is contained in the one
    // we've read from the pltfile
    AMREX_ALWAYS_ASSERT(
      m_geoms[0].ProbDomain().contains(a_level_geom.ProbDomain(), 0.0000001));

    // Check the refRatio between PltFile level 0 and ours
    IntVect lev0rr = a_level_geom.Domain().size() / m_geoms[0].Domain().size();

    // Same domain size, just do a fill patch single level
    if (lev0rr == IntVect::TheUnitVector()) {
      PhysBCFunct<GpuBndryFuncFab<FillExtDirDummy>> bndry_func(
        a_level_geom, {dummyBCRec}, FillExtDirDummy{});
      FillPatchSingleLevel(
        a_mf, IntVect(0), 0.0, {&(m_data[a_lev])}, {0.0}, pltComp, dataComp,
        nComp, a_level_geom, bndry_func, 0);

      // Our level 0 is finer than the PltFile one.
    } else if (lev0rr.max() > 1) {

      // Interpolator (need EB version ?)
      InterpBase* mapper = &mf_cell_cons_interp;

      // Start by filling all the data with a coarseInterp. We've checked that
      // the geom RealBoxes match already, so PltFile level 0 is good to interp.
      {
        PhysBCFunct<GpuBndryFuncFab<FillExtDirDummy>> crse_bndry_func(
          m_geoms[0], {dummyBCRec}, FillExtDirDummy{});
        PhysBCFunct<GpuBndryFuncFab<FillExtDirDummy>> fine_bndry_func(
          a_level_geom, {dummyBCRec}, FillExtDirDummy{});
        InterpFromCoarseLevel(
          a_mf, IntVect(0), 0.0, m_data[0], pltComp, dataComp, nComp,
          m_geoms[0], a_level_geom, crse_bndry_func, 0, fine_bndry_func, 0,
          lev0rr, mapper, {dummyBCRec}, 0);
      }

      // Then get data from the PltFile finer levels if any
      for (int pltlev = 1; pltlev < m_geoms.size(); pltlev++) {

        IntVect rr =
          a_level_geom.Domain().size() / m_geoms[pltlev].Domain().size();

        // Current Plt level resolution matches our: lets interp and wrap it up
        if (rr == IntVect::TheUnitVector()) {
          MultiFab temp(m_grids[pltlev], m_dmaps[pltlev], nComp, 0);
          PhysBCFunct<GpuBndryFuncFab<FillExtDirDummy>> bndry_func(
            m_geoms[pltlev], {dummyBCRec}, FillExtDirDummy{});
          FillPatchSingleLevel(
            temp, IntVect(0), 0.0, {&m_data[pltlev]}, {0.0}, pltComp, 0, nComp,
            m_geoms[pltlev], bndry_func, 0);

          a_mf.ParallelCopy(temp, 0, dataComp, nComp);

          break;
        }

        // Otherwise do another InterpFromCoarseLevel
        MultiFab temp(refine(m_grids[pltlev], rr), m_dmaps[pltlev], nComp, 0);
        PhysBCFunct<GpuBndryFuncFab<FillExtDirDummy>> crse_bndry_func(
          m_geoms[pltlev], {dummyBCRec}, FillExtDirDummy{});
        PhysBCFunct<GpuBndryFuncFab<FillExtDirDummy>> fine_bndry_func(
          a_level_geom, {dummyBCRec}, FillExtDirDummy{});
        InterpFromCoarseLevel(
          temp, IntVect(0), 0.0, m_data[pltlev], pltComp, 0, nComp,
          m_geoms[pltlev], a_level_geom, crse_bndry_func, 0, fine_bndry_func, 0,
          rr, mapper, {dummyBCRec}, 0);
        a_mf.ParallelCopy(temp, 0, dataComp, nComp);
      }

    } else {
      // Otherwise bail out because we don't handle averaging_down (TODO ?)
      Abort("When initializing dataFromPlt, our level 0 can't be coarser than "
            "the PltFile one");
    }
  } else {
    // Check the refRatio between PltFile level 0 and the current level
    IntVect lev0rr = a_level_geom.Domain().size() / m_geoms[0].Domain().size();

    // Interpolator (need EB version ?)
    InterpBase* mapper = &mf_cell_cons_interp;

    // Start by filling the entire level with level 0 from PltFile, to ensure we
    // have some data everywhere
    {
      PhysBCFunct<GpuBndryFuncFab<FillExtDirDummy>> crse_bndry_func(
        m_geoms[0], {dummyBCRec}, FillExtDirDummy{});
      PhysBCFunct<GpuBndryFuncFab<FillExtDirDummy>> fine_bndry_func(
        a_level_geom, {dummyBCRec}, FillExtDirDummy{});
      InterpFromCoarseLevel(
        a_mf, IntVect(0), 0.0, m_data[0], pltComp, dataComp, nComp, m_geoms[0],
        a_level_geom, crse_bndry_func, 0, fine_bndry_func, 0, lev0rr, mapper,
        {dummyBCRec}, 0);
    }

    // Then get data from the PltFile finer levels if any
    for (int pltlev = 1; pltlev < m_geoms.size(); pltlev++) {

      IntVect rr =
        a_level_geom.Domain().size() / m_geoms[pltlev].Domain().size();

      // Current Plt level resolution matches our: lets interp and wrap it up
      if (rr == IntVect::TheUnitVector()) {
        MultiFab temp(m_grids[pltlev], m_dmaps[pltlev], nComp, 0);
        PhysBCFunct<GpuBndryFuncFab<FillExtDirDummy>> bndry_func(
          m_geoms[pltlev], {dummyBCRec}, FillExtDirDummy{});
        FillPatchSingleLevel(
          temp, IntVect(0), 0.0, {&m_data[pltlev]}, {0.0}, pltComp, 0, nComp,
          m_geoms[pltlev], bndry_func, 0);

        a_mf.ParallelCopy(temp, 0, dataComp, nComp);

        break;
      }

      // Otherwise do another InterpFromCoarseLevel
      MultiFab temp(refine(m_grids[pltlev], rr), m_dmaps[pltlev], nComp, 0);
      PhysBCFunct<GpuBndryFuncFab<FillExtDirDummy>> crse_bndry_func(
        m_geoms[pltlev], {dummyBCRec}, FillExtDirDummy{});
      PhysBCFunct<GpuBndryFuncFab<FillExtDirDummy>> fine_bndry_func(
        a_level_geom, {dummyBCRec}, FillExtDirDummy{});
      InterpFromCoarseLevel(
        temp, IntVect(0), 0.0, m_data[pltlev], pltComp, 0, nComp,
        m_geoms[pltlev], a_level_geom, crse_bndry_func, 0, fine_bndry_func, 0,
        rr, mapper, {dummyBCRec}, 0);
      a_mf.ParallelCopy(temp, 0, dataComp, nComp);
    }
  }
}